

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction_internal.cpp
# Opt level: O3

void cfd::TransactionContextUtil::Verify<cfd::core::Transaction>
               (Transaction *transaction,OutPoint *outpoint,UtxoData *utxo,AbstractTxIn *txin,
               function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
               *create_sighash_func)

{
  ByteData BVar1;
  char cVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  CfdException *pCVar6;
  AddressType AVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong __val;
  uint8_t leaf_version;
  bool has_parity;
  bool has_pubkey;
  WitnessVersion version;
  SchnorrSignature schnorr_sig;
  ByteData signature;
  SchnorrPubkey witness_program;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> signature_stack;
  Script script;
  SchnorrPubkey internal_pubkey;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  uint32_t req_num;
  SigHashType sighashtype_1;
  ByteData256 sighash;
  ByteData annex;
  UtxoData work_utxo;
  undefined8 in_stack_fffffffffffff908;
  undefined8 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff91c;
  uchar local_6cf;
  bool local_6ce;
  bool local_6cd;
  WitnessVersion local_6cc;
  string local_6c8;
  int local_69c;
  undefined1 local_698 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_688 [3];
  int local_654;
  undefined1 local_650 [24];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_638;
  undefined1 local_620 [56];
  Transaction *local_5e8;
  function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
  *local_5e0;
  OutPoint *local_5d8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_5d0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5b8;
  ulong local_5a0;
  uint local_594 [3];
  Pubkey local_588;
  ByteData256 local_570;
  ulong local_558;
  ByteData local_550;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_538;
  UtxoData local_520;
  ulong __n;
  
  local_5e8 = transaction;
  local_5e0 = create_sighash_func;
  local_5d8 = outpoint;
  bVar3 = IsOpTrueLockingScript(utxo,txin);
  if (bVar3) {
    return;
  }
  UtxoData::UtxoData(&local_520,utxo);
  if (local_520.address_type == kP2shAddress) {
    local_6c8._M_dataplus._M_p = (pointer)0x0;
    local_6c8._M_string_length = 0;
    local_6c8.field_2._M_allocated_capacity = 0;
    cfd::core::AbstractTxIn::GetUnlockingScript();
    cfd::core::Script::GetElementList();
    local_688[0]._M_allocated_capacity = local_6c8.field_2._M_allocated_capacity;
    local_698._8_8_ = local_6c8._M_string_length;
    local_698._0_8_ = local_6c8._M_dataplus._M_p;
    local_6c8.field_2._M_allocated_capacity =
         (size_type)
         local_638.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_6c8._M_dataplus._M_p =
         (pointer)local_638.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_6c8._M_string_length =
         (size_type)
         local_638.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_638.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_638.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_638.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_698);
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_638);
    core::Script::~Script((Script *)local_620);
    if (local_6c8._M_string_length - (long)local_6c8._M_dataplus._M_p == 0x60) {
      cfd::core::ScriptElement::GetBinaryData();
      cfd::core::Script::Script((Script *)local_620,(ByteData *)local_698);
      if ((pointer)local_698._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_698._0_8_);
      }
      cVar4 = cfd::core::Script::IsP2wpkhScript();
      AVar7 = kP2shP2wpkhAddress;
      if (cVar4 == '\0') {
        cVar4 = cfd::core::Script::IsP2wshScript();
        AVar7 = kP2shP2wshAddress;
        if (cVar4 != '\0') goto LAB_001cbdce;
      }
      else {
LAB_001cbdce:
        local_520.address_type = AVar7;
      }
      core::Script::~Script((Script *)local_620);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &local_6c8);
  }
  local_6cd = false;
  local_6cc = kVersionNone;
  GetVerifySignatureStack(&local_638,&local_520,txin,&local_6cc,&local_6cd);
  if (local_6cc == kVersion1) {
    cfd::core::Script::GetElementList();
    cfd::core::ScriptElement::GetBinaryData();
    cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_650,(ByteData *)local_620);
    if ((pointer)local_620._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_620._0_8_);
    }
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               local_698);
    cfd::core::SchnorrSignature::SchnorrSignature((SchnorrSignature *)&local_6c8);
    local_6ce = false;
    local_6cf = '\0';
    cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)&local_5d0);
    local_5b8.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5b8.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5b8.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cfd::core::Script::Script((Script *)local_620);
    cfd::core::ByteData::ByteData(&local_550);
    cfd::core::TaprootUtil::ParseTaprootSignData
              ((vector *)&local_638,(SchnorrSignature *)&local_6c8,&local_6ce,&local_6cf,
               (SchnorrPubkey *)&local_5d0,(vector *)&local_5b8,(Script *)local_620,(vector *)0x0,
               &local_550);
    if (local_6cd != true) {
      cfd::core::TaprootUtil::VerifyTaprootCommitment
                (local_6ce,local_6cf,(SchnorrPubkey *)local_650,(SchnorrPubkey *)&local_5d0,
                 (vector *)&local_5b8,(Script *)local_620,(ByteData256 *)0x0);
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_698._0_8_ = local_698 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_698,"The script analysis of tapscript is not supported.","");
      core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_698);
      __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    cfd::core::SchnorrSignature::GetSigHashType();
    cfd::core::Pubkey::Pubkey(&local_588);
    cfd::core::Script::Script((Script *)local_698);
    std::
    function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
    ::operator()(&local_570,local_5e0,local_5e8,local_5d8,&local_520,(SigHashType *)local_594,
                 &local_588,(Script *)local_698,local_6cc,&local_550,(TaprootScriptTree *)0x0);
    core::Script::~Script((Script *)local_698);
    if (local_588.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_588.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cVar4 = cfd::core::SchnorrPubkey::Verify
                      ((SchnorrSignature *)local_650,(ByteData256 *)&local_6c8);
    if (cVar4 == '\0') {
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_698._0_8_ = local_698 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_698,"Verify signature fail.","");
      core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_698);
      __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (local_570.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_570.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_550.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_550.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::Script::~Script((Script *)local_620);
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_5b8);
    if (local_5d0.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5d0.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_6c8._M_dataplus._M_p);
    }
  }
  else {
    if (local_6cd != true) {
      cfd::core::Script::Script
                ((Script *)local_620,
                 (ByteData *)
                 ((long)local_638.
                        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -0x18));
      cVar4 = cfd::core::Script::IsMultisigScript();
      if (cVar4 == '\0') {
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_698._0_8_ = local_698 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_698,"Unsupported script format. verify support is multisig only."
                   ,"");
        core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_698);
        __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      if (local_520.address_type == kP2shAddress) {
        cfd::core::ByteData::GetHex_abi_cxx11_();
        iVar5 = std::__cxx11::string::compare(local_698);
        if ((pointer)local_698._0_8_ != (pointer)(local_698 + 0x10)) {
          operator_delete((void *)local_698._0_8_);
        }
        if (iVar5 != 0) {
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          local_698._0_8_ = (pointer)(local_698 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_698,"Invalid multisig format. top stack is OP_0 only.","");
          core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_698);
          __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      else {
        cVar4 = cfd::core::ByteData::IsEmpty();
        if (cVar4 == '\0') {
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          local_698._0_8_ = local_698 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_698,"Invalid multisig format. top byte is empty only.","");
          core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_698);
          __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      local_594[0] = 0;
      cfd::core::ScriptUtil::ExtractPubkeysFromMultisigScript((Script *)local_650,(uint *)local_620)
      ;
      uVar8 = (int)((ulong)((long)local_638.
                                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_638.
                                 super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 - 2;
      __n = (ulong)uVar8;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
                (&local_5d0,__n,(allocator_type *)local_698);
      std::vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_>::vector
                ((vector<cfd::core::SigHashType,_std::allocator<cfd::core::SigHashType>_> *)
                 &local_5b8,__n,(allocator_type *)local_698);
      if (uVar8 < local_594[0]) {
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        local_698._0_8_ = local_698 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_698,"Signature count is less than multisig require count.","");
        core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_698);
        __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      local_698._0_8_ = local_698 + 0x10;
      local_698._8_8_ = (pointer)0x0;
      local_688[0]._M_allocated_capacity = local_688[0]._M_allocated_capacity & 0xffffffffffffff00;
      cfd::core::SigHashType::SigHashType((SigHashType *)&local_588);
      if (__n == 0) {
        local_69c = 0;
      }
      else {
        local_654 = -1;
        local_69c = 0;
        __val = 0;
        local_5a0 = __n;
        do {
          local_558 = __val + 1;
          cfd::core::CryptoUtil::ConvertSignatureFromDer
                    (&local_550,
                     (SigHashType *)
                     ((long)local_638.
                            super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_558 * 0x18));
          cfd::core::Pubkey::Pubkey((Pubkey *)&local_6c8);
          std::
          function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
          ::operator()(&local_570,local_5e0,local_5e8,local_5d8,&local_520,(SigHashType *)&local_588
                       ,(Pubkey *)&local_6c8,(Script *)local_620,local_6cc,(ByteData *)0x0,
                       (TaprootScriptTree *)0x0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_6c8._M_dataplus._M_p);
          }
          if (local_650._8_8_ != local_650._0_8_) {
            lVar10 = 0;
            uVar9 = 0;
            do {
              cVar4 = cfd::core::SignatureUtil::VerifyEcSignature
                                (&local_570,(Pubkey *)(local_650._0_8_ + lVar10),&local_550);
              if (cVar4 != '\0') {
                if ((int)uVar9 <= local_654) {
                  pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
                  local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_6c8,"Signature order is incorrect.","");
                  core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,&local_6c8);
                  __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException
                             );
                }
                local_69c = local_69c + 1;
                __n = local_5a0;
                local_654 = (int)uVar9;
                goto LAB_001cc529;
              }
              uVar9 = uVar9 + 1;
              lVar10 = lVar10 + 0x18;
            } while (uVar9 < (ulong)(((long)(local_650._8_8_ - local_650._0_8_) >> 3) *
                                    -0x5555555555555555));
          }
          if ((pointer)local_698._8_8_ != (pointer)0x0) {
            std::__cxx11::string::append(local_698);
          }
          __n = local_5a0;
          cVar4 = '\x01';
          if (9 < __val) {
            uVar9 = __val;
            cVar2 = '\x04';
            do {
              cVar4 = cVar2;
              if (uVar9 < 100) {
                cVar4 = cVar4 + -2;
                goto LAB_001cc4d5;
              }
              if (uVar9 < 1000) {
                cVar4 = cVar4 + -1;
                goto LAB_001cc4d5;
              }
              if (uVar9 < 10000) goto LAB_001cc4d5;
              bVar3 = 99999 < uVar9;
              uVar9 = uVar9 / 10000;
              cVar2 = cVar4 + '\x04';
            } while (bVar3);
            cVar4 = cVar4 + '\x01';
          }
LAB_001cc4d5:
          local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
          std::__cxx11::string::_M_construct((ulong)&local_6c8,cVar4);
          std::__detail::__to_chars_10_impl<unsigned_long>
                    (local_6c8._M_dataplus._M_p,(uint)local_6c8._M_string_length,__val);
          std::__cxx11::string::_M_append(local_698,(ulong)local_6c8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
            operator_delete(local_6c8._M_dataplus._M_p);
          }
LAB_001cc529:
          if (local_570.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_570.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_550.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_550.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          __val = local_558;
        } while (local_558 != __n);
      }
      if (local_69c != (int)__n) {
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        std::operator+(&local_6c8,"Verify signature fail. fail index = ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_698);
        core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,&local_6c8);
        __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      if ((pointer)local_698._0_8_ != (pointer)(local_698 + 0x10)) {
        operator_delete((void *)local_698._0_8_);
      }
      if (local_5b8.
          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_5b8.
                        super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_5d0);
      std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
                ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)local_650);
      core::Script::~Script((Script *)local_620);
      goto LAB_001cc5c2;
    }
    cfd::core::SigHashType::SigHashType((SigHashType *)&local_5d0);
    cfd::core::CryptoUtil::ConvertSignatureFromDer
              ((ByteData *)local_698,
               (SigHashType *)
               local_638.
               super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl
               .super__Vector_impl_data._M_start);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_538,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)local_638.
                      super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                      _M_impl.super__Vector_impl_data._M_start + 0x18));
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff910;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff908;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffff918;
    BVar1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffff91c;
    cfd::core::Pubkey::Pubkey((Pubkey *)&local_6c8,BVar1);
    if (local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_538.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    cfd::core::Script::Script((Script *)local_620);
    std::
    function<cfd::core::ByteData256_(const_cfd::core::Transaction_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
    ::operator()((ByteData256 *)local_650,local_5e0,local_5e8,local_5d8,&local_520,
                 (SigHashType *)&local_5d0,(Pubkey *)&local_6c8,(Script *)local_620,local_6cc,
                 (ByteData *)0x0,(TaprootScriptTree *)0x0);
    core::Script::~Script((Script *)local_620);
    cVar4 = cfd::core::SignatureUtil::VerifyEcSignature
                      ((ByteData256 *)local_650,(Pubkey *)&local_6c8,(ByteData *)local_698);
    if (cVar4 == '\0') {
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      local_620._0_8_ = local_620 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_620,"Verify signature fail.","");
      core::CfdException::CfdException(pCVar6,kCfdIllegalStateError,(string *)local_620);
      __cxa_throw(pCVar6,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if ((pointer)local_650._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_650._0_8_);
    }
    local_650._0_8_ = local_698._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_6c8._M_dataplus._M_p);
      local_650._0_8_ = local_698._0_8_;
    }
  }
  if ((pointer)local_650._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_650._0_8_);
  }
LAB_001cc5c2:
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_638);
  UtxoData::~UtxoData(&local_520);
  return;
}

Assistant:

void TransactionContextUtil::Verify(
    const Tx* transaction, const OutPoint& outpoint, const UtxoData& utxo,
    const AbstractTxIn* txin,
    std::function<ByteData256(
        const Tx*, const OutPoint&, const UtxoData&, const SigHashType&,
        const Pubkey&, const Script&, WitnessVersion, const ByteData*,
        const TaprootScriptTree*)>
        create_sighash_func) {
  if (TransactionContextUtil::IsOpTrueLockingScript(utxo, txin)) {
    return;  // OP_TRUE only.
  }

  // Correspondence when addressType is extracted from address string.
  UtxoData work_utxo = utxo;
  if (work_utxo.address_type == AddressType::kP2shAddress) {
    std::vector<ScriptElement> items;
    items = txin->GetUnlockingScript().GetElementList();
    if (items.size() == 1) {
      Script script = Script(items[0].GetBinaryData());
      if (script.IsP2wpkhScript()) {
        work_utxo.address_type = AddressType::kP2shP2wpkhAddress;
      } else if (script.IsP2wshScript()) {
        work_utxo.address_type = AddressType::kP2shP2wshAddress;
      }
    }
  }

  bool has_pubkey = false;
  WitnessVersion version = WitnessVersion::kVersionNone;
  std::vector<ByteData> signature_stack =
      TransactionContextUtil::GetVerifySignatureStack(
          work_utxo, txin, &version, &has_pubkey);

  if (version == WitnessVersion::kVersion1) {
    SchnorrPubkey witness_program(
        utxo.locking_script.GetElementList()[1].GetBinaryData());
    SchnorrSignature schnorr_sig;
    bool has_parity = false;
    uint8_t leaf_version = 0;
    SchnorrPubkey internal_pubkey;
    std::vector<ByteData256> nodes;
    Script tapscript;
    ByteData annex;
    TaprootUtil::ParseTaprootSignData(
        signature_stack, &schnorr_sig, &has_parity, &leaf_version,
        &internal_pubkey, &nodes, &tapscript, nullptr, &annex);
    if (has_pubkey) {
      auto sighash = create_sighash_func(
          transaction, outpoint, work_utxo, schnorr_sig.GetSigHashType(),
          Pubkey(), Script(), version, &annex, nullptr);
      bool is_verify = witness_program.Verify(schnorr_sig, sighash);
      if (!is_verify) {
        throw CfdException(
            CfdError::kCfdIllegalStateError, "Verify signature fail.");
      }
    } else {
      TaprootUtil::VerifyTaprootCommitment(
          has_parity, leaf_version, witness_program, internal_pubkey, nodes,
          tapscript);
      // At the moment, there is no function to run Script,
      // so no further confirmation is possible.
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "The script analysis of tapscript is not supported.");
    }
  } else if (has_pubkey) {
    SigHashType sighashtype;
    ByteData signature =
        CryptoUtil::ConvertSignatureFromDer(signature_stack[0], &sighashtype);
    Pubkey pubkey(signature_stack[1]);
    auto sighash = create_sighash_func(
        transaction, outpoint, work_utxo, sighashtype, pubkey, Script(),
        version, nullptr, nullptr);
    bool is_verify =
        SignatureUtil::VerifyEcSignature(sighash, pubkey, signature);
    if (!is_verify) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Verify signature fail.");
    }
  } else {
    // check script format
    Script redeem_script(signature_stack.back());
    if (!redeem_script.IsMultisigScript()) {
      // At the moment, there is no function to run Script,
      // so no further confirmation is possible.
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Unsupported script format. verify support is multisig only.");
    }
    if (work_utxo.address_type == AddressType::kP2shAddress) {
      if (signature_stack[0].GetHex() != "00") {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Invalid multisig format. top stack is OP_0 only.");
      }
    } else {
      if (!signature_stack[0].IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Invalid multisig format. top byte is empty only.");
      }
    }
    uint32_t req_num = 0;
    std::vector<Pubkey> pubkeys =
        ScriptUtil::ExtractPubkeysFromMultisigScript(redeem_script, &req_num);

    uint32_t sig_size = static_cast<uint32_t>(signature_stack.size()) - 2;
    std::vector<ByteData> signatures(sig_size);
    std::vector<SigHashType> sighashtype_list(sig_size);
    if (sig_size < req_num) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Signature count is less than multisig require count.");
    }

    uint32_t success_count = 0;
    std::string fail_indexes;
    SigHashType sighashtype;
    int prev_key_index = -1;
    for (size_t index = 0; index < sig_size; ++index) {
      bool is_exist = false;
      auto signature = CryptoUtil::ConvertSignatureFromDer(
          signature_stack[index + 1], &sighashtype);
      auto sighash = create_sighash_func(
          transaction, outpoint, work_utxo, sighashtype, Pubkey(),
          redeem_script, version, nullptr, nullptr);
      for (size_t key_index = 0; key_index < pubkeys.size(); ++key_index) {
        const auto& pubkey = pubkeys[key_index];
        is_exist =
            SignatureUtil::VerifyEcSignature(sighash, pubkey, signature);
        if (is_exist) {
          if (prev_key_index >= static_cast<int>(key_index)) {
            throw CfdException(
                CfdError::kCfdIllegalStateError,
                "Signature order is incorrect.");
          }
          prev_key_index = static_cast<int>(key_index);
          break;
        }
      }
      if (is_exist) {
        ++success_count;
      } else {
        if (!fail_indexes.empty()) fail_indexes += ",";
        fail_indexes += std::to_string(index);
      }
    }

    if (success_count != sig_size) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Verify signature fail. fail index = " + fail_indexes);
    }
  }
}